

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  __type _Var2;
  Argument *pAVar3;
  ofstream *out;
  string *out_00;
  char *out_01;
  string_view aArgumentName;
  string_view aArgumentName_00;
  string_view aArgumentName_01;
  string_view aArgumentName_02;
  string_view aArgumentName_03;
  string_view aArgumentName_04;
  string_view aArgumentName_05;
  string_view aArgumentName_06;
  string_view aArgumentName_07;
  bool local_641;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> output_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  any local_5e0;
  any local_5d0;
  any local_5c0;
  any local_5b0;
  any local_5a0;
  any local_590;
  any local_580;
  ArgumentParser program;
  string local_4f0;
  string local_4d0 [32];
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  ifstream inf;
  byte abStack_410 [488];
  ofstream outf;
  byte abStack_208 [480];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"vm",(allocator<char> *)&inf);
  argparse::ArgumentParser::ArgumentParser(&program,&local_4f0);
  std::__cxx11::string::~string((string *)&local_4f0);
  pAVar3 = argparse::ArgumentParser::add_argument<char_const*>(&program,"input");
  pAVar3->field_0xbc = pAVar3->field_0xbc | 2;
  std::__cxx11::string::string<std::allocator<char>>
            (local_450,"speicify the file to be assembled/executed.",(allocator<char> *)&inf);
  std::__cxx11::string::operator=((string *)&pAVar3->mHelp,local_450);
  std::__cxx11::string::~string(local_450);
  pAVar3 = argparse::ArgumentParser::add_argument<char_const*>(&program,"-d");
  local_580._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_580._M_storage._M_ptr = (void *)0x0;
  std::any::operator=(&pAVar3->mDefaultValue,&local_580);
  local_590._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_590._M_storage = (_Storage)0x1;
  pAVar3 = argparse::Argument::implicit_value(pAVar3,&local_590);
  std::__cxx11::string::string<std::allocator<char>>
            (local_470,"disassemble the binary input file.",(allocator<char> *)&inf);
  std::__cxx11::string::operator=((string *)&pAVar3->mHelp,local_470);
  std::__cxx11::string::~string(local_470);
  std::any::reset(&local_590);
  std::any::reset(&local_580);
  pAVar3 = argparse::ArgumentParser::add_argument<char_const*>(&program,"-a");
  local_5a0._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_5a0._M_storage._M_ptr = (void *)0x0;
  std::any::operator=(&pAVar3->mDefaultValue,&local_5a0);
  local_5b0._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_5b0._M_storage = (_Storage)0x1;
  pAVar3 = argparse::Argument::implicit_value(pAVar3,&local_5b0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_490,"assemble the text input file.",(allocator<char> *)&inf);
  std::__cxx11::string::operator=((string *)&pAVar3->mHelp,local_490);
  std::__cxx11::string::~string(local_490);
  std::any::reset(&local_5b0);
  std::any::reset(&local_5a0);
  pAVar3 = argparse::ArgumentParser::add_argument<char_const*>(&program,"-r");
  local_5c0._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_5c0._M_storage._M_ptr = (void *)0x0;
  std::any::operator=(&pAVar3->mDefaultValue,&local_5c0);
  local_5d0._M_manager = std::any::_Manager_internal<bool>::_S_manage;
  local_5d0._M_storage = (_Storage)0x1;
  pAVar3 = argparse::Argument::implicit_value(pAVar3,&local_5d0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4b0,"interpret the binary input file.",(allocator<char> *)&inf);
  std::__cxx11::string::operator=((string *)&pAVar3->mHelp,local_4b0);
  std::__cxx11::string::~string(local_4b0);
  std::any::reset(&local_5d0);
  std::any::reset(&local_5c0);
  pAVar3 = argparse::ArgumentParser::add_argument<char_const*>(&program,"output");
  std::__cxx11::string::string<std::allocator<char>>((string *)&inf,"-",(allocator<char> *)&outf);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            (&local_5e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inf);
  std::any::operator=(&pAVar3->mDefaultValue,&local_5e0);
  pAVar3->field_0xbc = pAVar3->field_0xbc | 2;
  std::__cxx11::string::string<std::allocator<char>>
            (local_4d0,"specify the output file.",(allocator<char> *)&input_file);
  std::__cxx11::string::operator=((string *)&pAVar3->mHelp,local_4d0);
  std::__cxx11::string::~string(local_4d0);
  std::any::reset(&local_5e0);
  std::__cxx11::string::~string((string *)&inf);
  argparse::ArgumentParser::parse_args(&program,argc,argv);
  aArgumentName._M_str = "input";
  aArgumentName._M_len = 5;
  argparse::ArgumentParser::get<std::__cxx11::string>(&input_file,&program,aArgumentName);
  aArgumentName_00._M_str = "output";
  aArgumentName_00._M_len = 6;
  argparse::ArgumentParser::get<std::__cxx11::string>(&output_file,&program,aArgumentName_00);
  std::ifstream::ifstream(&inf);
  std::ofstream::ofstream(&outf);
  aArgumentName_01._M_str = "-d";
  aArgumentName_01._M_len = 2;
  pAVar3 = argparse::ArgumentParser::operator[](&program,aArgumentName_01);
  local_600._M_dataplus._M_p._0_1_ = 1;
  bVar1 = argparse::Argument::operator==(pAVar3,(bool *)&local_600);
  if (bVar1) {
    aArgumentName_02._M_str = "-a";
    aArgumentName_02._M_len = 2;
    pAVar3 = argparse::ArgumentParser::operator[](&program,aArgumentName_02);
    local_600._M_dataplus._M_p._0_1_ = 1;
    bVar1 = argparse::Argument::operator==(pAVar3,(bool *)&local_600);
    if (!bVar1) {
      aArgumentName_03._M_str = "-r";
      aArgumentName_03._M_len = 2;
      pAVar3 = argparse::ArgumentParser::operator[](&program,aArgumentName_03);
      local_641 = true;
      bVar1 = argparse::Argument::operator==(pAVar3,&local_641);
      if (bVar1) goto LAB_00109109;
      std::ifstream::open((string *)&inf,(_Ios_Openmode)&input_file);
      if ((abStack_410[*(long *)(_inf + -0x18)] & 5) != 0) goto LAB_00109109;
      bVar1 = std::operator!=(&output_file,"-");
      if (bVar1) {
        _Var2 = std::operator==(&input_file,&output_file);
        if (_Var2) {
          std::__cxx11::string::append((char *)&output_file);
        }
        out_00 = (string *)&outf;
        std::ofstream::open(out_00,(_Ios_Openmode)&output_file);
        if ((abStack_208[*(long *)(_outf + -0x18)] & 5) != 0) {
          std::ifstream::close();
          goto LAB_00109109;
        }
      }
      else {
        out_00 = (string *)&std::cout;
      }
      disassemble_binary(&inf,(ostream *)out_00);
      goto LAB_00109017;
    }
    goto LAB_00109109;
  }
  aArgumentName_04._M_str = "-a";
  aArgumentName_04._M_len = 2;
  pAVar3 = argparse::ArgumentParser::operator[](&program,aArgumentName_04);
  local_600._M_dataplus._M_p._0_1_ = 1;
  bVar1 = argparse::Argument::operator==(pAVar3,(bool *)&local_600);
  if (!bVar1) {
    aArgumentName_07._M_str = "-r";
    aArgumentName_07._M_len = 2;
    pAVar3 = argparse::ArgumentParser::operator[](&program,aArgumentName_07);
    local_600._M_dataplus._M_p._0_1_ = 1;
    bVar1 = argparse::Argument::operator==(pAVar3,(bool *)&local_600);
    if (bVar1) {
      std::ifstream::open((string *)&inf,(_Ios_Openmode)&input_file);
      if ((abStack_410[*(long *)(_inf + -0x18)] & 5) == 0) {
        out_01 = "-";
        bVar1 = std::operator!=(&output_file,"-");
        if (bVar1) {
          _Var2 = std::operator==(&input_file,&output_file);
          if (_Var2) {
            std::__cxx11::string::append((char *)&output_file);
          }
          out_01 = (char *)&output_file;
          std::ofstream::open((string *)&outf,(_Ios_Openmode)out_01);
          if ((abStack_208[*(long *)(_outf + -0x18)] & 5) != 0) {
            std::ifstream::close();
            goto LAB_00109109;
          }
        }
        execute(&inf,(ostream *)out_01);
        goto LAB_00109017;
      }
    }
    goto LAB_00109109;
  }
  aArgumentName_05._M_str = "-d";
  aArgumentName_05._M_len = 2;
  pAVar3 = argparse::ArgumentParser::operator[](&program,aArgumentName_05);
  local_600._M_dataplus._M_p._0_1_ = 1;
  bVar1 = argparse::Argument::operator==(pAVar3,(bool *)&local_600);
  if (bVar1) goto LAB_00109109;
  std::ifstream::open((string *)&inf,(_Ios_Openmode)&input_file);
  if ((abStack_410[*(long *)(_inf + -0x18)] & 5) != 0) goto LAB_00109109;
  bVar1 = std::operator==(&output_file,"-");
  if (bVar1) {
LAB_00108e6d:
    std::operator+(&local_600,&input_file,".out");
    std::__cxx11::string::operator=((string *)&output_file,(string *)&local_600);
    std::__cxx11::string::~string((string *)&local_600);
  }
  else {
    _Var2 = std::operator==(&input_file,&output_file);
    if (_Var2) goto LAB_00108e6d;
  }
  std::ofstream::open((string *)&outf,(_Ios_Openmode)&output_file);
  if ((abStack_208[*(long *)(_outf + -0x18)] & 5) == 0) {
    out = (ofstream *)__dynamic_cast(&outf,&std::ostream::typeinfo,&std::ofstream::typeinfo,0);
    aArgumentName_06._M_str = "-r";
    aArgumentName_06._M_len = 2;
    pAVar3 = argparse::ArgumentParser::operator[](&program,aArgumentName_06);
    local_600._M_dataplus._M_p._0_1_ = 1;
    bVar1 = argparse::Argument::operator==(pAVar3,(bool *)&local_600);
    assemble_text(&inf,out,bVar1);
LAB_00109017:
    std::ifstream::close();
    std::ofstream::close();
    std::ofstream::~ofstream(&outf);
    std::ifstream::~ifstream(&inf);
    std::__cxx11::string::~string((string *)&output_file);
    std::__cxx11::string::~string((string *)&input_file);
    argparse::ArgumentParser::~ArgumentParser(&program);
    return 0;
  }
  std::ifstream::close();
LAB_00109109:
  exit(2);
}

Assistant:

int main (int argc, char** argv) {
    argparse::ArgumentParser program("vm");
	program.add_argument("input")
        .required()
		.help("speicify the file to be assembled/executed.");
	program.add_argument("-d")
		.default_value(false)
		.implicit_value(true)
		.help("disassemble the binary input file.");
	program.add_argument("-a")
		.default_value(false)
		.implicit_value(true)
		.help("assemble the text input file.");
    program.add_argument("-r")
		.default_value(false)
		.implicit_value(true)
		.help("interpret the binary input file.");
    program.add_argument("output")
		.default_value(std::string("-"))
        .required()
		.help("specify the output file.");

	try {
		program.parse_args(argc, argv);
	}
	catch (const std::runtime_error& err) {
		std::cout << program;
		exit(2);
	}

	auto input_file = program.get<std::string>("input");
	auto output_file = program.get<std::string>("output");
	std::ifstream* input;
	std::ostream* output;
	std::ifstream inf;
	std::ofstream outf;
    //std::unique_ptr<vm::VM> vm;

    if (program["-d"] == true) {
        if (program["-a"] == true || program["-r"] == true) {
            exit(2);
        }
        
        inf.open(input_file, std::ios::binary | std::ios::in);
        if (!inf) {
            exit(2);
        }
        input = &inf;

        if (output_file != "-") {
            if (input_file == output_file) {
                output_file += ".out";
            }
            outf.open(output_file, std::ios::out | std::ios::trunc);
            if (!outf) {
                inf.close();
                exit(2);
            }
            output = &outf;
        }
        else {
            output = &std::cout;
        }
        disassemble_binary(input, output);
    }
    else if (program["-a"] == true) {
        if (program["-d"] == true) {
            exit(2);
        }
        
        inf.open(input_file, std::ios::in);
        if (!inf) {
            exit(2);
        }
        input = &inf;

        if (output_file == "-" || input_file == output_file) {
            output_file = input_file + ".out";
        }
        outf.open(output_file, std::ios::binary | std::ios::out | std::ios::trunc);
        if (!outf) {
            inf.close();
            exit(2);
        }
        output = &outf;
        assemble_text(input, dynamic_cast<std::ofstream*>(output), program["-r"] == true);
    }
    else if (program["-r"] == true) {
        inf.open(input_file, std::ios::binary | std::ios::in);
        if (!inf) {
            exit(2);
        }
        input = &inf;

        if (output_file != "-") {
            if (input_file == output_file) {
                output_file += ".out";
            }
            outf.open(output_file, std::ios::out | std::ios::trunc);
            if (!outf) {
                inf.close();
                exit(2);
            }
            output = &outf;
        }
        else {
            output = &std::cout;
        }

        execute(input, output);
    }
    else {
        exit(2);
    }
    inf.close();
    outf.close();
    return 0;
}